

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastEvR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  int iVar2;
  int value;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar7;
  ulong uVar8;
  ParseContext *ctx_00;
  ushort *puVar9;
  uint *puVar10;
  RepeatedField<int> *this;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  this = (RepeatedField<int> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  cVar1 = *ptr;
  puVar10 = *(uint **)((long)&table->has_bits_offset +
                      ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  do {
    uVar4 = (ulong)*(char *)((long)ptr + 1);
    if ((long)uVar4 < 0) {
      aVar7.data = (long)(char)*(ushort *)((long)ptr + 2) << 7 | 0x7f;
      if ((long)aVar7 < 0) {
        ctx_00 = (ParseContext *)((long)*(char *)((long)ptr + 3) << 0xe | 0x3fff);
        if ((long)ctx_00 < 0) {
          aVar7.data = aVar7.data & ((long)(char)*(ushort *)((long)ptr + 4) << 0x15 | 0x1fffffU);
          if ((long)aVar7 < 0) {
            ctx_00 = (ParseContext *)
                     ((ulong)ctx_00 & ((long)*(char *)((long)ptr + 5) << 0x1c | 0xfffffffU));
            if ((long)ctx_00 < 0) {
              aVar7.data = aVar7.data &
                           ((long)(char)*(ushort *)((long)ptr + 6) << 0x23 | 0x7ffffffffU);
              if ((long)aVar7 < 0) {
                ctx_00 = (ParseContext *)
                         ((ulong)ctx_00 & ((long)*(char *)((long)ptr + 7) << 0x2a | 0x3ffffffffffU))
                ;
                if ((long)ctx_00 < 0) {
                  aVar7.data = aVar7.data &
                               ((long)(char)*(ushort *)((long)ptr + 8) << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar7 < 0) {
                    ctx_00 = (ParseContext *)
                             ((ulong)ctx_00 &
                             ((ulong)*(byte *)((long)ptr + 9) << 0x38 | 0xffffffffffffff));
                    if ((long)ctx_00 < 0) {
                      puVar9 = (ushort *)((long)ptr + 0xb);
                      if (((char)*(ushort *)((long)ptr + 10) != '\x01') &&
                         ((char)*(ushort *)((long)ptr + 10) < '\0')) {
                        pcVar5 = Error(msg,ptr,ctx_00,(TcFieldData)aVar7,table,hasbits);
                        return pcVar5;
                      }
                    }
                    else {
                      puVar9 = (ushort *)((long)ptr + 10);
                    }
                  }
                  else {
                    puVar9 = (ushort *)((long)ptr + 9);
                  }
                }
                else {
                  puVar9 = (ushort *)((long)ptr + 8);
                }
              }
              else {
                puVar9 = (ushort *)((long)ptr + 7);
              }
            }
            else {
              puVar9 = (ushort *)((long)ptr + 6);
            }
          }
          else {
            puVar9 = (ushort *)((long)ptr + 5);
          }
        }
        else {
          puVar9 = (ushort *)((long)ptr + 4);
        }
        aVar7.data = aVar7.data & (ulong)ctx_00;
      }
      else {
        puVar9 = (ushort *)((long)ptr + 3);
      }
      uVar4 = uVar4 & aVar7.data;
    }
    else {
      puVar9 = (ushort *)((long)ptr + 2);
    }
    uVar6 = (ulong)(*puVar10 >> 0x10);
    value = (int)uVar4;
    uVar4 = (long)value - (long)(short)*puVar10;
    uVar8 = uVar4 - uVar6;
    if (uVar6 <= uVar4) {
      uVar3 = puVar10[1];
      if (uVar8 < (uVar3 & 0xffff)) {
        aVar7.data._4_4_ = 0;
        aVar7.data._0_4_ = puVar10[(uVar8 >> 5) + 2];
        if ((puVar10[(uVar8 >> 5) + 2] >> ((uint)uVar8 & 0x1f) & 1) == 0) {
LAB_00292239:
          pcVar5 = FastUnknownEnumFallback(msg,ptr,ctx,(TcFieldData)aVar7,table,hasbits);
          return pcVar5;
        }
      }
      else {
        aVar7.data = (long)puVar10 + (ulong)(uVar3 >> 3 & 0x1ffc) + 8;
        uVar4 = 0;
        do {
          if (uVar3 >> 0x10 <= uVar4) goto LAB_00292239;
          iVar2 = *(int *)(aVar7.data + uVar4 * 4);
          uVar4 = (uVar4 * 2 - (ulong)(value < iVar2)) + 2;
        } while (iVar2 != value);
      }
    }
    RepeatedField<int>::Add(this,value);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar9) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar10 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar10 & 3) != 0) {
          AlignFail();
        }
        *puVar10 = *puVar10 | (uint)hasbits;
      }
      return (char *)puVar9;
    }
    ptr = (char *)puVar9;
    if ((char)*puVar9 != cVar1) {
      uVar3 = (uint)table->fast_idx_mask & (uint)*puVar9;
      if ((uVar3 & 7) == 0) {
        uVar4 = (ulong)(uVar3 & 0xfffffff8);
        pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                                   (msg,puVar9,ctx,
                                    (ulong)*puVar9 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2)
                                    ,table,hasbits);
        return pcVar5;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEvR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnum<uint8_t, field_layout::kTvEnum>(
      PROTOBUF_TC_PARAM_PASS);
}